

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O3

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  value_type *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  string *result_00;
  string nstrs;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  uVar9 = result->_M_string_length;
  iVar6 = 0;
  iVar8 = 0;
  if ((((3 < uVar9) && (pcVar2 = (result->_M_dataplus)._M_p, iVar8 = iVar6, *pcVar2 == '[')) &&
      (pcVar2[1] == '[')) && ((pcVar2[uVar9 - 1] == ']' && (pcVar2[uVar9 - 2] == ']')))) {
    pvVar10 = (value_type *)(local_70 + 0x10);
    local_70._16_2_ = 0x5b;
    local_70._8_8_ = (value_type *)0x1;
    local_70._0_8_ = pvVar10;
    if (uVar9 - 5 < 0xfffffffffffffffd) {
      uVar9 = 2;
      do {
        pcVar3 = (result->_M_dataplus)._M_p;
        if (pcVar3[uVar9] != pcVar3[uVar9 + 1]) {
          iVar8 = 0;
          bVar4 = true;
          goto LAB_0018b896;
        }
        ::std::__cxx11::string::push_back((char)local_70);
        uVar9 = uVar9 + 2;
      } while (uVar9 < result->_M_string_length - 2);
    }
    ::std::__cxx11::string::push_back((char)local_70);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    iVar8 = 1;
    bVar4 = false;
LAB_0018b896:
    if ((value_type *)local_70._0_8_ != pvVar10) {
      operator_delete((void *)local_70._0_8_);
    }
    if (!bVar4) {
      return 1;
    }
  }
  if (((this->allow_extra_args_ == false) && (this->expected_max_ < 2)) ||
     ((result->_M_string_length == 0 ||
      ((pcVar2 = (result->_M_dataplus)._M_p, *pcVar2 != '[' ||
       (pcVar2[result->_M_string_length - 1] != ']')))))) {
    cVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    if ((cVar1 == '\0') ||
       (lVar7 = ::std::__cxx11::string::find((char)result,(ulong)(uint)(int)cVar1), lVar7 == -1)) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,result);
      return iVar8 + 1;
    }
    detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70,result,(this->super_OptionBase<CLI::Option>).delimiter_);
    uVar5 = local_70._8_8_;
    for (pvVar10 = (value_type *)local_70._0_8_; pvVar10 != (value_type *)uVar5;
        pvVar10 = pvVar10 + 1) {
      if (pvVar10->_M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(res,pvVar10);
        iVar8 = iVar8 + 1;
      }
    }
  }
  else {
    ::std::__cxx11::string::pop_back();
    ::std::__cxx11::string::_M_erase((ulong)result,0);
    pcVar3 = (result->_M_dataplus)._M_p;
    local_50._M_allocated_capacity = (size_type)local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + result->_M_string_length);
    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,(string *)&local_50,',');
    result_00 = (string *)local_70._0_8_;
    pvVar10 = (value_type *)local_70._8_8_;
    if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
      result_00 = (string *)local_70._0_8_;
      pvVar10 = (value_type *)local_70._8_8_;
    }
    for (; result_00 != pvVar10; result_00 = result_00 + 1) {
      if (result_00->_M_string_length != 0) {
        iVar6 = _add_result(this,result_00,res);
        iVar8 = iVar8 + iVar6;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  return iVar8;
}

Assistant:

CLI11_INLINE int Option::_add_result(std::string &&result, std::vector<std::string> &res) const {
    int result_count = 0;

    // Handle the vector escape possibility all characters duplicated and starting with [[ ending with ]]
    // this is always a single result
    if(result.size() >= 4 && result[0] == '[' && result[1] == '[' && result.back() == ']' &&
       (*(result.end() - 2) == ']')) {
        // this is an escape clause for odd strings
        std::string nstrs{'['};
        bool duplicated{true};
        for(std::size_t ii = 2; ii < result.size() - 2; ii += 2) {
            if(result[ii] == result[ii + 1]) {
                nstrs.push_back(result[ii]);
            } else {
                duplicated = false;
                break;
            }
        }
        if(duplicated) {
            nstrs.push_back(']');
            res.push_back(std::move(nstrs));
            ++result_count;
            return result_count;
        }
    }

    if((allow_extra_args_ || get_expected_max() > 1) && !result.empty() && result.front() == '[' &&
       result.back() == ']') {  // this is now a vector string likely from the default or user entry

        result.pop_back();
        result.erase(result.begin());
        bool skipSection{false};
        for(auto &var : CLI::detail::split_up(result, ',')) {
            if(!var.empty()) {
                result_count += _add_result(std::move(var), res);
            }
        }
        if(!skipSection) {
            return result_count;
        }
    }
    if(delimiter_ == '\0') {
        res.push_back(std::move(result));
        ++result_count;
    } else {
        if((result.find_first_of(delimiter_) != std::string::npos)) {
            for(const auto &var : CLI::detail::split(result, delimiter_)) {
                if(!var.empty()) {
                    res.push_back(var);
                    ++result_count;
                }
            }
        } else {
            res.push_back(std::move(result));
            ++result_count;
        }
    }
    return result_count;
}